

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiInputEvent * FindLatestInputEvent(ImGuiInputEventType type,int arg)

{
  ImGuiContext *pIVar1;
  ImGuiInputEvent *pIVar2;
  int in_ESI;
  ImGuiInputEventType in_EDI;
  ImGuiInputEvent *e;
  int n;
  ImGuiContext *g;
  int local_1c;
  
  pIVar1 = GImGui;
  local_1c = (GImGui->InputEventsQueue).Size;
  while( true ) {
    do {
      local_1c = local_1c + -1;
      if (local_1c < 0) {
        return (ImGuiInputEvent *)0x0;
      }
      pIVar2 = ImVector<ImGuiInputEvent>::operator[](&pIVar1->InputEventsQueue,local_1c);
    } while ((pIVar2->Type != in_EDI) ||
            ((in_EDI == ImGuiInputEventType_Key && ((pIVar2->field_2).MouseButton.Button != in_ESI))
            ));
    if (in_EDI != ImGuiInputEventType_MouseButton) break;
    if ((pIVar2->field_2).MouseButton.Button == in_ESI) {
      return pIVar2;
    }
  }
  return pIVar2;
}

Assistant:

static ImGuiInputEvent* FindLatestInputEvent(ImGuiInputEventType type, int arg = -1)
{
    ImGuiContext& g = *GImGui;
    for (int n = g.InputEventsQueue.Size - 1; n >= 0; n--)
    {
        ImGuiInputEvent* e = &g.InputEventsQueue[n];
        if (e->Type != type)
            continue;
        if (type == ImGuiInputEventType_Key && e->Key.Key != arg)
            continue;
        if (type == ImGuiInputEventType_MouseButton && e->MouseButton.Button != arg)
            continue;
        return e;
    }
    return NULL;
}